

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

int vocready(voccxdef *ctx,char **cmd,int *typelist,int cur,objnum cmdActor,objnum cmdPrep,
            char *vverb,char *vprep,vocoldef *dolist,vocoldef *iolist,int *errp,char *cmdbuf,
            int first_word,uchar **preparse_list,int *next_start)

{
  int iVar1;
  int in_ECX;
  long in_RSI;
  long in_RDI;
  undefined8 in_stack_00000008;
  char *in_stack_00000010;
  int *in_stack_00000028;
  char buf [128];
  vocoldef *in_stack_000003e8;
  char *in_stack_000003f0;
  char *in_stack_000003f8;
  objnum in_stack_00000404;
  objnum in_stack_00000406;
  voccxdef *in_stack_00000408;
  vocoldef *in_stack_00000440;
  char **in_stack_00000448;
  int *in_stack_00000450;
  char *in_stack_00000458;
  int in_stack_00000460;
  uchar **in_stack_00000468;
  int *in_stack_00000470;
  char *in_stack_fffffffffffffed0;
  char *local_f8;
  char local_c8 [164];
  int local_24;
  
  if ((in_ECX == -1) ||
     (((*(long *)(in_RSI + (long)in_ECX * 8) != 0 && (**(char **)(in_RSI + (long)in_ECX * 8) != ',')
       ) && (**(char **)(in_RSI + (long)in_ECX * 8) != '.')))) {
    local_24 = 0;
  }
  else {
    if ((*(byte *)(in_RDI + 0x119a) & 4) != 0) {
      if (in_stack_00000010 == (char *)0x0) {
        local_f8 = "";
      }
      else {
        local_f8 = in_stack_00000010;
      }
      sprintf(local_c8,". executing verb:  %s %s\\n",in_stack_00000008,local_f8);
      outformat(in_stack_fffffffffffffed0);
    }
    iVar1 = execmd(in_stack_00000408,in_stack_00000406,in_stack_00000404,in_stack_000003f8,
                   in_stack_000003f0,in_stack_000003e8,in_stack_00000440,in_stack_00000448,
                   in_stack_00000450,in_stack_00000458,in_stack_00000460,in_stack_00000468,
                   in_stack_00000470);
    *in_stack_00000028 = iVar1;
    local_24 = 1;
  }
  return local_24;
}

Assistant:

static int vocready(voccxdef *ctx, char *cmd[], int *typelist, int cur,
                    objnum cmdActor, objnum cmdPrep, char *vverb, char *vprep,
                    vocoldef *dolist, vocoldef *iolist, int *errp,
                    char *cmdbuf, int first_word, uchar **preparse_list,
                    int *next_start)
{
    if (cur != -1
        && (cmd[cur] == (char *)0
            || vocspec(cmd[cur], VOCW_AND) || vocspec(cmd[cur], VOCW_THEN)))
    {
        if (ctx->voccxflg & VOCCXFDBG)
        {
            char buf[128];
            
            sprintf(buf, ". executing verb:  %s %s\\n",
                    vverb, vprep ? vprep : "");
            tioputs(ctx->vocxtio, buf);
        }

        *errp = execmd(ctx, cmdActor, cmdPrep, vverb, vprep, dolist, iolist,
                       &cmd[first_word], &typelist[first_word],cmdbuf,
                       cur - first_word, preparse_list, next_start);
        return(TRUE);
    }
    return(FALSE);
}